

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pd~.c
# Opt level: O3

void pd_tilde_close(t_pd_tilde *x)

{
  FILE *__stream;
  FILE *__stream_00;
  
  __stream = (FILE *)x->x_infd;
  __stream_00 = (FILE *)x->x_outfd;
  x->x_infd = (FILE *)0x0;
  x->x_outfd = (FILE *)0x0;
  if (__stream_00 != (FILE *)0x0) {
    fclose(__stream_00);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (0 < x->x_childpid) {
    waitpid(x->x_childpid,(int *)0x0,0);
  }
  binbuf_clear(x->x_binbuf);
  x->x_infd = (FILE *)0x0;
  x->x_outfd = (FILE *)0x0;
  x->x_childpid = -1;
  return;
}

Assistant:

static void pd_tilde_close(t_pd_tilde *x)
{
#ifdef _WIN32
    int termstat;
#endif
    FILE *infd = x->x_infd, *outfd = x->x_outfd;
    x->x_infd = x->x_outfd = 0;
    if (outfd)
        fclose(outfd);
    if (infd)
        fclose(infd);
    if (x->x_childpid > 0)
#ifdef _WIN32
        _cwait(&termstat, x->x_childpid, WAIT_CHILD);
#else
        waitpid(x->x_childpid, 0, 0);
#endif
    binbuf_clear(x->x_binbuf);
    x->x_infd = x->x_outfd = 0;
    x->x_childpid = -1;
}